

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O0

void __thiscall PacketIO::Start(PacketIO *this,RxDataHandler rxData)

{
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint8_t *__buf;
  ssize_t sVar5;
  int length;
  void *pkt_data;
  packet_mreq mreq;
  ifreq ifr;
  RxDataHandler rxData_local;
  PacketIO *this_local;
  
  uVar1 = htons(3);
  iVar2 = socket(0x11,3,(uint)uVar1);
  this->m_RawSocket = iVar2;
  if (this->m_RawSocket != -1) {
    GetInterface((char *)mreq.mr_address);
    printf("Using interface \'%s\'\n",mreq.mr_address);
    iVar2 = ioctl(this->m_RawSocket,0x8933,mreq.mr_address);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      printf("oh crap %s\n",pcVar4);
    }
    this->m_IfIndex = ifr.ifr_ifrn._8_4_;
    pkt_data._4_2_ = 1;
    pkt_data._6_2_ = 6;
    iVar2 = setsockopt(this->m_RawSocket,0x107,1,&pkt_data,0x10);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      printf("promiscuous membership error %s",pcVar4);
    }
    __buf = (uint8_t *)malloc(0x5ea);
    do {
      sVar5 = recvfrom(this->m_RawSocket,__buf,0x5ea,0,(sockaddr *)0x0,(socklen_t *)0x0);
      (*rxData)(__buf,(long)(int)sVar5);
    } while( true );
  }
  piVar3 = __errno_location();
  if (*piVar3 == 1) {
    printf("need root privileges, try \'sudo ./test_app\'\n");
    exit(-1);
  }
  printf("Error while creating socket. Aborting...\n");
  return;
}

Assistant:

void PacketIO::Start(RxDataHandler rxData)
{
    m_RawSocket = socket(AF_PACKET, SOCK_RAW, htons(ETH_P_ALL));
    if (m_RawSocket == -1)
    {
        if (errno == EPERM)
        {
            printf("need root privileges, try 'sudo ./test_app'\n");
            exit(-1);
        }
        else
        {
            printf("Error while creating socket. Aborting...\n");
        }
    }
    else
    {
        struct ifreq ifr;
        PacketIO::GetInterface(ifr.ifr_name);
        printf("Using interface '%s'\n", ifr.ifr_name);

        // Find the socket index for tx later
        if (ioctl(m_RawSocket, SIOCGIFINDEX, &ifr) == -1)
        {
            printf("oh crap %s\n", strerror(errno));
        }
        m_IfIndex = ifr.ifr_ifindex;

        // Set socket to promiscuous mode
        struct packet_mreq mreq;
        mreq.mr_ifindex = ifr.ifr_ifindex;
        mreq.mr_type = PACKET_MR_PROMISC;
        mreq.mr_alen = 6;
        if (setsockopt(
                m_RawSocket, SOL_PACKET, PACKET_ADD_MEMBERSHIP, &mreq, (socklen_t)sizeof(mreq)) < 0)
        {
            printf("promiscuous membership error %s", strerror(errno));
        }

        void* pkt_data = (void*)malloc(ETH_FRAME_LEN);
        while (1)
        {
            int length = recvfrom(m_RawSocket, pkt_data, ETH_FRAME_LEN, 0, nullptr, nullptr);
            rxData((uint8_t*)pkt_data, length);
        }
        free(pkt_data); // no way to get here, but ...
    }
}